

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O0

void __thiscall
iutest::detail::
iuConcatParamHolder<iutest::detail::iuValueArray<int,_int>,_iutest::detail::iuParamGenerator<bool>_>
::params_t<int>::append(params_t<int> *this,IParamGenerater *gen)

{
  int iVar1;
  iuIParamGenerator<int> *piVar2;
  int local_30 [4];
  scoped_ptr<iutest::detail::iuIParamGenerator<int>_> local_20;
  scoped_ptr<iutest::detail::iuIParamGenerator<int>_> p;
  IParamGenerater *gen_local;
  params_t<int> *this_local;
  
  p.m_ptr = gen;
  scoped_ptr<iutest::detail::iuIParamGenerator<int>_>::scoped_ptr(&local_20,gen);
  piVar2 = scoped_ptr<iutest::detail::iuIParamGenerator<int>_>::operator->(&local_20);
  (*piVar2->_vptr_iuIParamGenerator[2])();
  while( true ) {
    piVar2 = scoped_ptr<iutest::detail::iuIParamGenerator<int>_>::operator->(&local_20);
    iVar1 = (*piVar2->_vptr_iuIParamGenerator[5])();
    if ((((byte)iVar1 ^ 0xff) & 1) == 0) break;
    piVar2 = scoped_ptr<iutest::detail::iuIParamGenerator<int>_>::operator->(&local_20);
    local_30[0] = (*piVar2->_vptr_iuIParamGenerator[3])();
    std::vector<int,_std::allocator<int>_>::push_back(&this->val,local_30);
    piVar2 = scoped_ptr<iutest::detail::iuIParamGenerator<int>_>::operator->(&local_20);
    (*piVar2->_vptr_iuIParamGenerator[4])();
  }
  scoped_ptr<iutest::detail::iuIParamGenerator<int>_>::~scoped_ptr(&local_20);
  return;
}

Assistant:

void append(IParamGenerater* gen)
        {
            detail::scoped_ptr<IParamGenerater> p(gen);
            for( p->Begin(); !p->IsEnd(); p->Next() )
            {
                val.push_back(p->GetCurrent());
            }
        }